

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetSOName(string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  long lVar2;
  Names local_100;
  allocator<char> local_29;
  ImportInfo *local_28;
  ImportInfo *info;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  info = (ImportInfo *)config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  bVar1 = IsImported(this);
  if (bVar1) {
    local_28 = GetImportInfo(this,(string *)info);
    if (local_28 == (ImportInfo *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_29);
      std::allocator<char>::~allocator(&local_29);
    }
    else if ((local_28->NoSOName & 1U) == 0) {
      lVar2 = std::__cxx11::string::find((char *)&local_28->SOName,0x79d2b7);
      if (lVar2 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_28->SOName);
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_28->SOName);
      }
    }
    else {
      cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&local_28->Location);
    }
  }
  else {
    GetLibraryNames(&local_100,this,(string *)info);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_100.SharedObject)
    ;
    Names::~Names(&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSOName(const std::string& config) const
{
  if (this->IsImported()) {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (info->NoSOName) {
        // The imported library has no builtin soname so the name
        // searched at runtime will be just the filename.
        return cmSystemTools::GetFilenameName(info->Location);
      }
      // Use the soname given if any.
      if (info->SOName.find("@rpath/") == 0) {
        return info->SOName.substr(6);
      }
      return info->SOName;
    }
    return "";
  }
  // Compute the soname that will be built.
  return this->GetLibraryNames(config).SharedObject;
}